

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long *__src;
  uint64_t uVar8;
  byte bVar9;
  size_t __n;
  uint64_t *puVar10;
  ulong __n_00;
  SVInt SVar11;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,bits);
  uVar1 = *(uint *)(plVar7 + 1);
  if (uVar1 <= in_EDX && in_EDX - uVar1 != 0) {
    if ((in_EDX < 0x41) && (*(char *)((long)plVar7 + 0xd) == '\0')) {
      SVInt(this,in_EDX,
            (ulong)((*plVar7 << (-(char)uVar1 & 0x3fU)) >> ((byte)(in_EDX - uVar1) & 0x3f)) >>
            (-(char)in_EDX & 0x3fU),*(bool *)((long)plVar7 + 0xc));
      uVar5 = extraout_RDX_00;
    }
    else {
      allocUninitialized(this,in_EDX,*(bool *)((long)plVar7 + 0xc),*(bool *)((long)plVar7 + 0xd));
      uVar1 = *(uint *)(plVar7 + 1) + 0x3f;
      uVar2 = uVar1 >> 6;
      uVar6 = in_EDX + 0x3f >> 6;
      puVar10 = (this->super_SVIntStorage).field_0.pVal;
      __src = plVar7;
      if ((*(byte *)((long)plVar7 + 0xd) & 1) != 0) {
        __src = (long *)*plVar7;
      }
      if (0x40 < *(uint *)(plVar7 + 1)) {
        __src = (long *)*plVar7;
      }
      __n_00 = (ulong)(uVar2 * 8);
      memcpy(puVar10,__src,__n_00);
      uVar4 = uVar2 - 1;
      bVar9 = ~(byte)uVar1;
      uVar8 = (long)(puVar10[uVar4] << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
      puVar10[uVar4] = uVar8;
      __n = (ulong)(uVar6 - uVar2) << 3;
      memset((void *)((long)puVar10 + __n_00),(int)((long)uVar8 >> 0x3f),__n);
      if (*(char *)((long)plVar7 + 0xd) == '\x01') {
        puVar10 = (this->super_SVIntStorage).field_0.pVal + uVar6;
        lVar3 = plVar7[1];
        memcpy(puVar10,(void *)(*plVar7 + (ulong)(uVar2 << 3)),__n_00);
        uVar8 = (long)(puVar10[uVar4] << (-(char)lVar3 & 0x3fU)) >> (-(char)lVar3 & 0x3fU);
        puVar10[uVar4] = uVar8;
        memset((void *)((long)puVar10 + (ulong)(uVar2 << 3)),(int)((long)uVar8 >> 0x3f),__n);
      }
      clearUnusedBits(this);
      uVar5 = extraout_RDX;
    }
    SVar11.super_SVIntStorage.bitWidth = (int)uVar5;
    SVar11.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
    SVar11.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
    SVar11.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
    SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
    return (SVInt)SVar11.super_SVIntStorage;
  }
  assert::assertFailed
            ("bits > bitWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x602,"SVInt slang::SVInt::sext(bitwidth_t) const");
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}